

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O2

void zzPowerMod(word *c,word *a,size_t n,word *b,size_t m,word *mod,void *stack)

{
  qr_o *r;
  void *stack_00;
  size_t no;
  size_t sVar1;
  
  no = wwOctetSize(mod,n);
  r = (qr_o *)((long)stack + n * 8);
  sVar1 = zmCreate_keep(no);
  stack_00 = (void *)((long)&(r->hdr).keep + sVar1);
  u64To(stack,no,mod);
  zmCreate(r,(octet *)stack,no,stack_00);
  u64To(stack,no,a);
  (*r->from)((word *)stack,(octet *)stack,r,stack_00);
  qrPower((word *)stack,(word *)stack,b,m,r,stack_00);
  (*r->to)((octet *)stack,(word *)stack,r,stack_00);
  u64From(c,stack,no);
  return;
}

Assistant:

void zzPowerMod(word c[], const word a[], size_t n, const word b[], size_t m,
	const word mod[], void* stack)
{
	size_t no;
	// переменные в stack
	word* t;
	qr_o* r;
	// pre
	ASSERT(n > 0 && mod[n - 1] != 0);
	ASSERT(wwCmp(a, mod, n) < 0);
	// размерности
	no = wwOctetSize(mod, n);
	// раскладка stack
	t = (word*)stack;
	r = (qr_o*)(t + n);
	stack = (octet*)r + zmCreate_keep(no);
	// r <- Zm(mod)
	wwTo(t, no, mod);
	zmCreate(r, (octet*)t, no, stack);
	// t <- a
	wwTo(t, no, a);
	qrFrom(t, (octet*)t, r, stack);
	// t <- a^b
	qrPower(t, t, b, m, r, stack);
	// c <- t
	qrTo((octet*)t, t, r, stack);
	wwFrom(c, t, no);
}